

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Application.h
# Opt level: O2

string * __thiscall
Application::genExecID_abi_cxx11_(string *__return_storage_ptr__,Application *this)

{
  int __val;
  
  __val = *(int *)((long)&this[10]._vptr_Application + 4) + 1;
  *(int *)((long)&this[10]._vptr_Application + 4) = __val;
  std::__cxx11::to_string(__return_storage_ptr__,__val);
  return __return_storage_ptr__;
}

Assistant:

std::string genExecID() { return std::to_string(++m_execID); }